

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osd_w.c
# Opt level: O1

int osd_w(mod2sparse *A,char *synd,char *osd0_decoding,char *osdw_decoding,double *log_prob_ratios,
         int osd_order,int A_rank,char **encoding_operator_inputs,int encoding_input_count)

{
  uint n;
  uint n_00;
  char *u;
  bool bVar1;
  int iVar2;
  int iVar3;
  mod2sparse *L;
  mod2sparse *U;
  mod2sparse *r;
  int *cols;
  int *cols_00;
  int *rows;
  char *x;
  char *out_vec;
  char *v;
  ulong uVar4;
  long lVar5;
  uint n_01;
  
  n = A->n_rows;
  n_00 = A->n_cols;
  n_01 = n_00 - A_rank;
  L = mod2sparse_allocate(n,A_rank);
  U = mod2sparse_allocate(A_rank,n_00);
  r = mod2sparse_allocate(n,n_01);
  cols = (int *)chk_alloc(n_01,4);
  cols_00 = (int *)chk_alloc(n_00,4);
  rows = (int *)chk_alloc(n,4);
  x = (char *)chk_alloc(n_00,1);
  out_vec = (char *)chk_alloc(n,1);
  v = (char *)chk_alloc(n,1);
  osd_0_solve(A,L,U,cols_00,rows,synd,osd0_decoding,log_prob_ratios,A_rank,1);
  if (0 < (int)n_01) {
    uVar4 = 0;
    do {
      cols[uVar4] = cols_00[(long)A_rank + uVar4];
      uVar4 = uVar4 + 1;
    } while (n_01 != uVar4);
  }
  mod2sparse_copycols(A,r,cols);
  iVar2 = bin_char_weight(osd0_decoding,n_00);
  if (0 < (int)n_00) {
    uVar4 = 0;
    do {
      osdw_decoding[uVar4] = osd0_decoding[uVar4];
      uVar4 = uVar4 + 1;
    } while (n_00 != uVar4);
  }
  if (encoding_input_count != 0) {
    lVar5 = 0;
    do {
      u = encoding_operator_inputs[lVar5];
      mod2sparse_mulvec(r,u,v);
      bin_char_add(synd,v,out_vec,n);
      LU_forward_backward_solve(L,U,rows,cols_00,out_vec,x);
      if (0 < (int)n_01) {
        uVar4 = 0;
        do {
          x[cols[uVar4]] = u[uVar4];
          uVar4 = uVar4 + 1;
        } while (n_01 != uVar4);
      }
      iVar3 = bin_char_weight(x,n_00);
      bVar1 = iVar3 < iVar2;
      if (iVar3 < iVar2) {
        iVar2 = iVar3;
      }
      if (bVar1 && 0 < (int)n_00) {
        uVar4 = 0;
        do {
          osdw_decoding[uVar4] = x[uVar4];
          uVar4 = uVar4 + 1;
          iVar2 = iVar3;
        } while (n_00 != uVar4);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != encoding_input_count);
  }
  free(v);
  free(cols);
  free(x);
  free(out_vec);
  mod2sparse_free(r);
  free(rows);
  free(cols_00);
  mod2sparse_free(L);
  mod2sparse_free(U);
  return 0;
}

Assistant:

int osd_w(
        mod2sparse *A, //parity check matrix
        char *synd, //syndrome
        char *osd0_decoding, //char string for OSD0 decoding
        char *osdw_decoding, //char string for higher order decoding
        double *log_prob_ratios, //the soft-decisions (from BP)
        int osd_order, //OSD order
        int A_rank, //rank of parity check matrix
        char **encoding_operator_inputs, //the list of higher order terms to search over
        int encoding_input_count //the number of higher order terms to search over
        ){

    int M = mod2sparse_rows(A);
    int N = mod2sparse_cols(A);

    int k= N - A_rank;
    mod2sparse *L=mod2sparse_allocate(M, A_rank);
    mod2sparse *U=mod2sparse_allocate(A_rank, N);
    mod2sparse *Ht=mod2sparse_allocate(M,k);
    int *Ht_cols=chk_alloc(k,sizeof(*Ht_cols));
    int *cols=chk_alloc(N,sizeof(*cols));
    int *rows=chk_alloc(M,sizeof(*rows));

    char *x;
    char *y=chk_alloc(N,sizeof(*y));
    char *g=chk_alloc(M,sizeof(*g));
    char *Htx=chk_alloc(M,sizeof(*Htx));

    //first we find the OSD-0 solutions
    osd_0_solve(
            A,
            L,
            U,
            cols,
            rows,
            synd,
            osd0_decoding,
            log_prob_ratios,
            A_rank,
            1);

    //create the H_T matrix
    for(int col_no=0;col_no<k;col_no++){
        Ht_cols[col_no]=cols[col_no + A_rank];
    }
    mod2sparse_copycols(A,Ht,Ht_cols);


    /*Calculate the weight of the OSD_0 solution. Higher order solutions are compared against this*/
    int osd_0_weight=bin_char_weight(osd0_decoding,N);

    /*Set OSD_0 as the benchmark to beat*/
    int osd_min_weight=osd_0_weight;
    for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=osd0_decoding[bit_no]; //osdw_decoding is set to osd0_decoding initially

    /*Search through the encoding strings*/
    int solution_weight;
    for(long unsigned int j=0; j<encoding_input_count;j++){

        x=encoding_operator_inputs[j];
        mod2sparse_mulvec(Ht,x,Htx);
        bin_char_add(synd,Htx,g,M);
        LU_forward_backward_solve(L, U, rows, cols, g, y);

        for(int col_no=0;col_no<k;col_no++){
                y[Ht_cols[col_no]]=x[col_no];
            }

        solution_weight=bin_char_weight(y,N);

        if(solution_weight<osd_min_weight){
            osd_min_weight=solution_weight;
            for(int bit_no=0;bit_no<N;bit_no++) osdw_decoding[bit_no]=y[bit_no];
        }

    }


    free(Htx);
    free(Ht_cols);
    free(y);
    free(g);
    mod2sparse_free(Ht);
    free(rows);
    free(cols);
    mod2sparse_free(L);
    mod2sparse_free(U);

    return 0;

}